

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

MainFunc __thiscall capnp::compiler::CompilerMain::getDecodeMain(CompilerMain *this)

{
  StringPtr extendedDescription;
  Iface *pIVar1;
  Iface *pIVar2;
  MainBuilder *pMVar3;
  Iface *extraout_RDX;
  CompilerMain *in_RSI;
  MainFunc MVar4;
  StringPtr version;
  StringPtr briefDescription;
  StringPtr helpText;
  StringPtr helpText_00;
  StringPtr helpText_01;
  StringPtr helpText_02;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  initializer_list<kj::MainBuilder::OptionName> names_01;
  initializer_list<kj::MainBuilder::OptionName> names_02;
  StringPtr title;
  StringPtr title_00;
  MainBuilder builder;
  Function<kj::MainBuilder::Validity_()> local_f8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_e8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_d8;
  Function<kj::MainBuilder::Validity_()> local_c8;
  Function<kj::MainBuilder::Validity_()> local_b8;
  Function<kj::MainBuilder::Validity_()> local_a8;
  Function<kj::MainBuilder::Validity_()> local_98;
  MainBuilder local_88;
  OptionName local_78;
  OptionName local_68;
  OptionName local_58;
  char *local_48;
  undefined8 uStack_40;
  OptionName local_38;
  undefined1 local_28;
  char *local_20;
  
  in_RSI->annotationFlag = DROP_ANNOTATIONS;
  in_RSI->compileEagerness = 1;
  local_48 = "";
  uStack_40 = 1;
  extendedDescription.content.size_ = 1;
  extendedDescription.content.ptr = "";
  version.content.size_ = 0x1e;
  version.content.ptr = "Cap\'n Proto version (unknown)";
  briefDescription.content.size_ = 0xef;
  briefDescription.content.ptr =
       "Decodes one or more encoded Cap\'n Proto messages as text.  The messages have root type <type> defined in <schema-file>.  Messages are read from standard input and by default are expected to be in standard Cap\'n Proto serialization format."
  ;
  kj::MainBuilder::MainBuilder
            (&local_88,in_RSI->context,version,briefDescription,extendedDescription);
  addGlobalOptions(in_RSI,&local_88);
  local_58.isLong = true;
  local_58.field_1.longName = "flat";
  local_98.impl.ptr = (Iface *)operator_new(0x18);
  (local_98.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002cac48;
  local_98.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_98.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::{lambda(auto:1&,(auto:2&&)...)#1},capnp::compiler::CompilerMain::getDecodeMain()::{lambda(auto:1&,(auto:2&&)...)#2}>>>
        ::instance;
  helpText.content.size_ = 0x7f;
  helpText.content.ptr =
       "Interpret the input as one large single-segment message rather than a stream in standard serialization format.  (Rarely used.)"
  ;
  names._M_len = 1;
  names._M_array = &local_58;
  pMVar3 = kj::MainBuilder::addOption(&local_88,names,&local_98,helpText);
  local_38.isLong = false;
  local_38.field_1.shortName = 'p';
  local_28 = 1;
  local_20 = "packed";
  local_a8.impl.ptr = (Iface *)operator_new(0x18);
  (local_a8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002cacb0;
  local_a8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_a8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::{lambda(auto:1&,(auto:2&&)...)#3},capnp::compiler::CompilerMain::getDecodeMain()::{lambda(auto:1&,(auto:2&&)...)#4}>>>
        ::instance;
  helpText_00.content.size_ = 0x122;
  helpText_00.content.ptr =
       "Expect the input to be packed using standard Cap\'n Proto packing, which deflates zero-valued bytes.  (This reads messages written with capnp::writePackedMessage*() from <capnp/serialize-packed.h>.  Do not use this for messages written with capnp::writeMessage*() from <capnp/serialize.h>.)"
  ;
  names_00._M_len = 2;
  names_00._M_array = &local_38;
  pMVar3 = kj::MainBuilder::addOption(pMVar3,names_00,&local_a8,helpText_00);
  local_68.isLong = true;
  local_68.field_1.longName = "short";
  local_b8.impl.ptr = (Iface *)operator_new(0x18);
  (local_b8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002cad18;
  local_b8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_b8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::{lambda(auto:1&,(auto:2&&)...)#5},capnp::compiler::CompilerMain::getDecodeMain()::{lambda(auto:1&,(auto:2&&)...)#6}>>>
        ::instance;
  helpText_01.content.size_ = 0x80;
  helpText_01.content.ptr =
       "Print in short (non-pretty) format.  Each message will be printed on one line, without using whitespace to improve readability."
  ;
  names_01._M_len = 1;
  names_01._M_array = &local_68;
  pMVar3 = kj::MainBuilder::addOption(pMVar3,names_01,&local_b8,helpText_01);
  local_78.isLong = true;
  local_78.field_1.longName = "quiet";
  local_c8.impl.ptr = (Iface *)operator_new(0x18);
  (local_c8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002cad80;
  local_c8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_c8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::{lambda(auto:1&,(auto:2&&)...)#7},capnp::compiler::CompilerMain::getDecodeMain()::{lambda(auto:1&,(auto:2&&)...)#8}>>>
        ::instance;
  helpText_02.content.size_ = 0xa5;
  helpText_02.content.ptr =
       "Do not print warning messages about the input being in the wrong format.  Use this if you find the warnings are wrong (but also let us know so we can improve them)."
  ;
  names_02._M_len = 1;
  names_02._M_array = &local_78;
  pMVar3 = kj::MainBuilder::addOption(pMVar3,names_02,&local_c8,helpText_02);
  local_d8.impl.ptr = (Iface *)operator_new(0x18);
  (local_d8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002cade8;
  local_d8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_d8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::{lambda(auto:1&,(auto:2&&)...)#9},capnp::compiler::CompilerMain::getDecodeMain()::{lambda(auto:1&,(auto:2&&)...)#10}>>>
        ::instance;
  title.content.size_ = 0xe;
  title.content.ptr = "<schema-file>";
  pMVar3 = kj::MainBuilder::expectArg(pMVar3,title,&local_d8);
  local_e8.impl.ptr = (Iface *)operator_new(0x18);
  (local_e8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002cae50;
  local_e8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_e8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::{lambda(auto:1&,(auto:2&&)...)#11},capnp::compiler::CompilerMain::getDecodeMain()::{lambda(auto:1&,(auto:2&&)...)#12}>>>
        ::instance;
  title_00.content.size_ = 7;
  title_00.content.ptr = "<type>";
  pMVar3 = kj::MainBuilder::expectArg(pMVar3,title_00,&local_e8);
  local_f8.impl.ptr = (Iface *)operator_new(0x18);
  (local_f8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002caeb8;
  local_f8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_f8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getDecodeMain()::{lambda(auto:1&,(auto:2&&)...)#13},capnp::compiler::CompilerMain::getDecodeMain()::{lambda(auto:1&,(auto:2&&)...)#14}>>>
        ::instance;
  kj::MainBuilder::callAfterParsing(pMVar3,&local_f8);
  pIVar1 = local_f8.impl.ptr;
  if (local_f8.impl.ptr != (Iface *)0x0) {
    local_f8.impl.ptr = (Iface *)0x0;
    (**(local_f8.impl.disposer)->_vptr_Disposer)
              (local_f8.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  pIVar2 = local_e8.impl.ptr;
  if (local_e8.impl.ptr != (Iface *)0x0) {
    local_e8.impl.ptr = (Iface *)0x0;
    (**(local_e8.impl.disposer)->_vptr_Disposer)
              (local_e8.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pIVar2 = local_d8.impl.ptr;
  if (local_d8.impl.ptr != (Iface *)0x0) {
    local_d8.impl.ptr = (Iface *)0x0;
    (**(local_d8.impl.disposer)->_vptr_Disposer)
              (local_d8.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pIVar1 = local_c8.impl.ptr;
  if (local_c8.impl.ptr != (Iface *)0x0) {
    local_c8.impl.ptr = (Iface *)0x0;
    (**(local_c8.impl.disposer)->_vptr_Disposer)
              (local_c8.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  pIVar1 = local_b8.impl.ptr;
  if (local_b8.impl.ptr != (Iface *)0x0) {
    local_b8.impl.ptr = (Iface *)0x0;
    (**(local_b8.impl.disposer)->_vptr_Disposer)
              (local_b8.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  pIVar1 = local_a8.impl.ptr;
  if (local_a8.impl.ptr != (Iface *)0x0) {
    local_a8.impl.ptr = (Iface *)0x0;
    (**(local_a8.impl.disposer)->_vptr_Disposer)
              (local_a8.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  pIVar1 = local_98.impl.ptr;
  if (local_98.impl.ptr != (Iface *)0x0) {
    local_98.impl.ptr = (Iface *)0x0;
    (**(local_98.impl.disposer)->_vptr_Disposer)
              (local_98.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  kj::MainBuilder::build((MainBuilder *)this);
  kj::MainBuilder::~MainBuilder(&local_88);
  MVar4.impl.ptr = extraout_RDX;
  MVar4.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar4.impl;
}

Assistant:

kj::MainFunc getDecodeMain() {
    // Only parse the schemas we actually need for decoding.
    compileEagerness = Compiler::NODE;

    // Drop annotations since we don't need them.  This avoids importing files like c++.capnp.
    annotationFlag = Compiler::DROP_ANNOTATIONS;

    kj::MainBuilder builder(context, VERSION_STRING,
          "Decodes one or more encoded Cap'n Proto messages as text.  The messages have root "
          "type <type> defined in <schema-file>.  Messages are read from standard input and "
          "by default are expected to be in standard Cap'n Proto serialization format.");
    addGlobalOptions(builder);
    builder.addOption({"flat"}, KJ_BIND_METHOD(*this, codeFlat),
                      "Interpret the input as one large single-segment message rather than a "
                      "stream in standard serialization format.  (Rarely used.)")
           .addOption({'p', "packed"}, KJ_BIND_METHOD(*this, codePacked),
                      "Expect the input to be packed using standard Cap'n Proto packing, which "
                      "deflates zero-valued bytes.  (This reads messages written with "
                      "capnp::writePackedMessage*() from <capnp/serialize-packed.h>.  Do not use "
                      "this for messages written with capnp::writeMessage*() from "
                      "<capnp/serialize.h>.)")
           .addOption({"short"}, KJ_BIND_METHOD(*this, printShort),
                      "Print in short (non-pretty) format.  Each message will be printed on one "
                      "line, without using whitespace to improve readability.")
           .addOption({"quiet"}, KJ_BIND_METHOD(*this, setQuiet),
                      "Do not print warning messages about the input being in the wrong format.  "
                      "Use this if you find the warnings are wrong (but also let us know so "
                      "we can improve them).")
           .expectArg("<schema-file>", KJ_BIND_METHOD(*this, addSource))
           .expectArg("<type>", KJ_BIND_METHOD(*this, setRootType))
           .callAfterParsing(KJ_BIND_METHOD(*this, decode));
    return builder.build();
  }